

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::RemoveLast(RepeatedField<unsigned_long> *this)

{
  this->current_size_ = this->current_size_ + -1;
  return;
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  current_size_--;
}